

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_record.c
# Opt level: O2

void init_altrace_record(int argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  FILE *pFVar4;
  int *piVar5;
  char *procname;
  char *pcVar6;
  
  fprintf(_stderr,"\n\n\n%s: starting up...\n",GAppName);
  fflush(_stderr);
  iVar1 = init_clock();
  if (iVar1 == 0) {
    fflush(_stderr);
  }
  else {
    iVar1 = load_real_openal();
    if (iVar1 != 0) {
      iVar1 = pthread_mutex_init((pthread_mutex_t *)&_apilock,(pthread_mutexattr_t *)0x0);
      pFVar4 = _stderr;
      pcVar6 = GAppName;
      if (iVar1 == 0) {
        apilock = &_apilock;
        pcVar6 = "MyOpenALProgram";
        if ((argv != (char **)0x0) && (pcVar3 = *argv, pcVar3 != (char *)0x0)) {
          pcVar2 = strrchr(pcVar3,0x2f);
          pcVar6 = pcVar2 + 1;
          if (pcVar2 == (char *)0x0) {
            pcVar6 = pcVar3;
          }
        }
        pcVar3 = sprintf_alloc("%s.altrace",pcVar6);
        iVar1 = 1;
        while (pcVar3 != (char *)0x0) {
          pFVar4 = fopen(pcVar3,"rb");
          if (pFVar4 == (FILE *)0x0) {
            logfd = open(pcVar3,0x241,0x1a4);
            pFVar4 = _stderr;
            pcVar6 = GAppName;
            if (logfd != -1) {
              fprintf(_stderr,"%s: Recording OpenAL session to log file \'%s\'\n\n\n",GAppName,
                      pcVar3);
              free(pcVar3);
              fflush(_stderr);
              writele32(0x104e5a1);
              writele32(1);
              return;
            }
            piVar5 = __errno_location();
            pcVar2 = strerror(*piVar5);
            goto LAB_00103c08;
          }
          fclose(pFVar4);
          free(pcVar3);
          pcVar3 = sprintf_alloc("%s.%d.altrace",pcVar6,iVar1);
          iVar1 = iVar1 + 1;
        }
        logfd = -1;
        pcVar2 = "Out of memory";
        pcVar6 = GAppName;
        pFVar4 = _stderr;
LAB_00103c08:
        fprintf(pFVar4,"%s: Failed to open OpenAL log file \'%s\': %s\n",pcVar6,pcVar3,pcVar2);
        free(pcVar3);
      }
      else {
        pcVar3 = strerror(iVar1);
        fprintf(pFVar4,"%s: Failed to create mutex: %s\n",pcVar6,pcVar3);
        apilock = &_apilock;
      }
      fflush(_stderr);
      quit_altrace_record();
    }
  }
  _exit(0x2a);
}

Assistant:

static void init_altrace_record(int argc, char **argv)
{
    int okay = 1;

    fprintf(stderr, "\n\n\n%s: starting up...\n", GAppName);
    fflush(stderr);

    if (!init_clock()) {
        fflush(stderr);
        _exit(42);
    }

    if (!load_real_openal()) {
        _exit(42);
    }

    if (okay) {
        const int rc = pthread_mutex_init(&_apilock, NULL);
        if (rc != 0) {
            fprintf(stderr, "%s: Failed to create mutex: %s\n", GAppName, strerror(rc));
            okay = 0;
        }
        apilock = &_apilock;
    }

    if (okay) {
        char *filename = choose_tracefile_name(argc, argv);
        logfd = filename ? open(filename, O_WRONLY | O_TRUNC | O_CREAT, 0644) : -1;
        if (logfd == -1) {
            fprintf(stderr, "%s: Failed to open OpenAL log file '%s': %s\n", GAppName, filename, filename ? strerror(errno) : "Out of memory");
            okay = 0;
        } else {
            fprintf(stderr, "%s: Recording OpenAL session to log file '%s'\n\n\n", GAppName, filename);
        }
        free(filename);
    }

    fflush(stderr);

    if (!okay) {
        quit_altrace_record();
        _exit(42);
    }

    IO_UINT32(ALTRACE_LOG_FILE_MAGIC);
    IO_UINT32(ALTRACE_LOG_FILE_FORMAT);
}